

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::WriteBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,string *rule,
          cmNinjaDeps *outputs,cmNinjaDeps *implicitOuts,cmNinjaDeps *explicitDeps,
          cmNinjaDeps *implicitDeps,cmNinjaDeps *orderOnlyDeps,cmNinjaVars *variables,
          string *rspfile,int cmdLineLimit,bool *usedResponseFile)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmNinjaDeps *pcVar1;
  bool bVar2;
  ulong uVar3;
  reference name;
  long lVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  string local_570 [39];
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  string local_500 [39];
  byte local_4d9;
  string local_4d8 [7];
  bool useResponseFile;
  string assignments;
  string buildstr;
  string local_490;
  reference local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  cmNinjaVars *__range1_2;
  ostringstream variable_assignments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  reference local_278;
  string *implicitOut;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  cmNinjaDeps *__range2_2;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  reference local_208;
  string *output;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  cmNinjaDeps *__range1_1;
  string build;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  reference local_188;
  string *orderOnlyDep;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  cmNinjaDeps *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  reference local_128;
  string *implicitDep;
  const_iterator __end2;
  const_iterator __begin2;
  cmNinjaDeps *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  reference local_c8;
  string *explicitDep;
  const_iterator __end1;
  const_iterator __begin1;
  cmNinjaDeps *__range1;
  string arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  cmNinjaDeps *local_38;
  cmNinjaDeps *implicitOuts_local;
  cmNinjaDeps *outputs_local;
  string *rule_local;
  string *comment_local;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_38 = implicitOuts;
  implicitOuts_local = outputs;
  outputs_local = (cmNinjaDeps *)rule;
  rule_local = comment;
  comment_local = (string *)os;
  os_local = (ostream *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::operator+(&local_58,"No rule for WriteBuildStatement! called with comment: ",rule_local);
    cmSystemTools::Error(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    return;
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(implicitOuts_local);
  if (bVar2) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&arguments.field_2 + 8);
    std::operator+(__return_storage_ptr__,
                   "No output files for WriteBuildStatement! called with comment: ",rule_local);
    cmSystemTools::Error(__return_storage_ptr__);
    std::__cxx11::string::~string((string *)(arguments.field_2._M_local_buf + 8));
    return;
  }
  WriteComment((ostream *)comment_local,rule_local);
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(explicitDeps);
  explicitDep = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(explicitDeps);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&explicitDep), bVar2) {
    local_c8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    EncodePath((string *)&__range2,this,local_c8);
    std::operator+(&local_e8," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
    std::__cxx11::string::operator+=((string *)&__range1,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(implicitDeps);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)&__range1," |");
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(implicitDeps);
    implicitDep = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(implicitDeps);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&implicitDep), bVar2) {
      local_128 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      EncodePath((string *)&__range2_1,this,local_128);
      std::operator+(&local_148," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range2_1);
      std::__cxx11::string::operator+=((string *)&__range1,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(orderOnlyDeps);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)&__range1," ||");
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(orderOnlyDeps);
    orderOnlyDep = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(orderOnlyDeps);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&orderOnlyDep), bVar2) {
      local_188 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      EncodePath((string *)((long)&build.field_2 + 8),this,local_188);
      std::operator+(&local_1a8," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&build.field_2 + 8));
      std::__cxx11::string::operator+=((string *)&__range1,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)(build.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  std::__cxx11::string::operator+=((string *)&__range1,"\n");
  std::__cxx11::string::string((string *)&__range1_1);
  std::__cxx11::string::operator+=((string *)&__range1_1,"build");
  pcVar1 = implicitOuts_local;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(implicitOuts_local);
  output = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(pcVar1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&output), bVar2) {
    local_208 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    EncodePath(&local_248,this,local_208);
    std::operator+(&local_228," ",&local_248);
    std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    if ((this->ComputingUnknownDependencies & 1U) != 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->CombinedBuildOutputs,local_208);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(local_38);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)&__range1_1," |");
    pcVar1 = local_38;
    __end2_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_38);
    implicitOut = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pcVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&implicitOut), bVar2) {
      local_278 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_2);
      EncodePath(&local_2b8,this,local_278);
      std::operator+(&local_298," ",&local_2b8);
      std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_2);
    }
  }
  std::__cxx11::string::operator+=((string *)&__range1_1,":");
  std::operator+(&local_2d8," ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)outputs_local)
  ;
  std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1_2);
  __end1_2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(variables);
  variable = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(variables);
  while (bVar2 = std::operator!=(&__end1_2,(_Self *)&variable), bVar2) {
    name = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&__end1_2);
    local_470 = name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"",(allocator<char> *)(buildstr.field_2._M_local_buf + 0xf));
    WriteVariable((ostream *)&__range1_2,&name->first,&name->second,&local_490,1);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)(buildstr.field_2._M_local_buf + 0xf));
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_2);
  }
  std::__cxx11::string::string
            ((string *)(assignments.field_2._M_local_buf + 8),(string *)&__range1_1);
  std::__cxx11::ostringstream::str();
  local_4d9 = 0;
  if (-1 < cmdLineLimit) {
    if (cmdLineLimit < 1) goto LAB_00365b12;
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    lVar6 = std::__cxx11::string::size();
    if (lVar4 + lVar5 + lVar6 + 1000U <= (ulong)(long)cmdLineLimit) goto LAB_00365b12;
  }
  std::__cxx11::string::string(local_500);
  std::__cxx11::ostringstream::str((string *)&__range1_2);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"RSP_FILE",&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"",&local_549);
  WriteVariable((ostream *)&__range1_2,&local_520,rspfile,&local_548,1);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=(local_4d8,local_570);
  std::__cxx11::string::~string(local_570);
  local_4d9 = 1;
LAB_00365b12:
  if (usedResponseFile != (bool *)0x0) {
    *usedResponseFile = (bool)(local_4d9 & 1);
  }
  poVar7 = std::operator<<((ostream *)comment_local,(string *)(assignments.field_2._M_local_buf + 8)
                          );
  poVar7 = std::operator<<(poVar7,(string *)&__range1);
  std::operator<<(poVar7,local_4d8);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string((string *)(assignments.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1_2);
  std::__cxx11::string::~string((string *)&__range1_1);
  std::__cxx11::string::~string((string *)&__range1);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuild(
  std::ostream& os, const std::string& comment, const std::string& rule,
  const cmNinjaDeps& outputs, const cmNinjaDeps& implicitOuts,
  const cmNinjaDeps& explicitDeps, const cmNinjaDeps& implicitDeps,
  const cmNinjaDeps& orderOnlyDeps, const cmNinjaVars& variables,
  const std::string& rspfile, int cmdLineLimit, bool* usedResponseFile)
{
  // Make sure there is a rule.
  if (rule.empty()) {
    cmSystemTools::Error("No rule for WriteBuildStatement! called "
                         "with comment: " +
                         comment);
    return;
  }

  // Make sure there is at least one output file.
  if (outputs.empty()) {
    cmSystemTools::Error("No output files for WriteBuildStatement! called "
                         "with comment: " +
                         comment);
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);

  std::string arguments;

  // TODO: Better formatting for when there are multiple input/output files.

  // Write explicit dependencies.
  for (std::string const& explicitDep : explicitDeps) {
    arguments += " " + EncodePath(explicitDep);
  }

  // Write implicit dependencies.
  if (!implicitDeps.empty()) {
    arguments += " |";
    for (std::string const& implicitDep : implicitDeps) {
      arguments += " " + EncodePath(implicitDep);
    }
  }

  // Write order-only dependencies.
  if (!orderOnlyDeps.empty()) {
    arguments += " ||";
    for (std::string const& orderOnlyDep : orderOnlyDeps) {
      arguments += " " + EncodePath(orderOnlyDep);
    }
  }

  arguments += "\n";

  std::string build;

  // Write outputs files.
  build += "build";
  for (std::string const& output : outputs) {
    build += " " + EncodePath(output);
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(output);
    }
  }
  if (!implicitOuts.empty()) {
    build += " |";
    for (std::string const& implicitOut : implicitOuts) {
      build += " " + EncodePath(implicitOut);
    }
  }
  build += ":";

  // Write the rule.
  build += " " + rule;

  // Write the variables bound to this build statement.
  std::ostringstream variable_assignments;
  for (auto const& variable : variables) {
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments, variable.first,
                                          variable.second, "", 1);
  }

  // check if a response file rule should be used
  std::string buildstr = build;
  std::string assignments = variable_assignments.str();
  bool useResponseFile = false;
  if (cmdLineLimit < 0 ||
      (cmdLineLimit > 0 &&
       (arguments.size() + buildstr.size() + assignments.size() + 1000) >
         static_cast<size_t>(cmdLineLimit))) {
    variable_assignments.str(std::string());
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments, "RSP_FILE",
                                          rspfile, "", 1);
    assignments += variable_assignments.str();
    useResponseFile = true;
  }
  if (usedResponseFile) {
    *usedResponseFile = useResponseFile;
  }

  os << buildstr << arguments << assignments;
}